

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_.cxx
# Opt level: O3

void __thiscall Fl_Menu_::Fl_Menu_(Fl_Menu_ *this,int X,int Y,int W,int H,char *l)

{
  uint *puVar1;
  
  Fl_Widget::Fl_Widget(&this->super_Fl_Widget,X,Y,W,H,l);
  (this->super_Fl_Widget)._vptr_Fl_Widget = (_func_int **)&PTR__Fl_Menu__00278848;
  puVar1 = &(this->super_Fl_Widget).flags_;
  *(byte *)puVar1 = (byte)*puVar1 | 0x40;
  (this->super_Fl_Widget).box_ = '\x02';
  (this->super_Fl_Widget).when_ = '\x06';
  this->menu_ = (Fl_Menu_Item *)0x0;
  this->value_ = (Fl_Menu_Item *)0x0;
  this->alloc = '\0';
  (this->super_Fl_Widget).color2_ = 0xf;
  this->textfont_ = 0;
  this->textsize_ = FL_NORMAL_SIZE;
  this->textcolor_ = 0;
  this->down_box_ = '\0';
  return;
}

Assistant:

Fl_Menu_::Fl_Menu_(int X,int Y,int W,int H,const char* l)
: Fl_Widget(X,Y,W,H,l) {
  set_flag(SHORTCUT_LABEL);
  box(FL_UP_BOX);
  when(FL_WHEN_RELEASE_ALWAYS);
  value_ = menu_ = 0;
  alloc = 0;
  selection_color(FL_SELECTION_COLOR);
  textfont(FL_HELVETICA);
  textsize(FL_NORMAL_SIZE);
  textcolor(FL_FOREGROUND_COLOR);
  down_box(FL_NO_BOX);
}